

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_aggregate.cpp
# Opt level: O2

void duckdb::RowOperations::UpdateFilteredStates
               (RowOperationsState *state,AggregateFilterData *filter_data,AggregateObject *aggr,
               Vector *addresses,DataChunk *payload,idx_t arg_idx)

{
  idx_t count;
  Vector filtered_addresses;
  Vector local_98;
  
  count = AggregateFilterData::ApplyFilter(filter_data,payload);
  if (count != 0) {
    Vector::Vector(&local_98,addresses,&filter_data->true_sel,count);
    Vector::Flatten(&local_98,count);
    UpdateStates(state,aggr,&local_98,&filter_data->filtered_payload,arg_idx,count);
    Vector::~Vector(&local_98);
  }
  return;
}

Assistant:

void RowOperations::UpdateFilteredStates(RowOperationsState &state, AggregateFilterData &filter_data,
                                         AggregateObject &aggr, Vector &addresses, DataChunk &payload, idx_t arg_idx) {
	idx_t count = filter_data.ApplyFilter(payload);
	if (count == 0) {
		return;
	}

	Vector filtered_addresses(addresses, filter_data.true_sel, count);
	filtered_addresses.Flatten(count);

	UpdateStates(state, aggr, filtered_addresses, filter_data.filtered_payload, arg_idx, count);
}